

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O1

void __thiscall
duckdb::ThreadLocalLogger::WriteLog
          (ThreadLocalLogger *this,char *log_type,LogLevel log_level,char *log_message)

{
  NotImplementedException *this_00;
  undefined7 in_register_00000011;
  string local_40;
  
  this_00 = (NotImplementedException *)
            __cxa_allocate_exception(0x10,log_type,CONCAT71(in_register_00000011,log_level));
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"ThreadLocalLogger::WriteLog","");
  NotImplementedException::NotImplementedException(this_00,&local_40);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ThreadLocalLogger::WriteLog(const char *log_type, LogLevel log_level, const char *log_message) {
	throw NotImplementedException("ThreadLocalLogger::WriteLog");
}